

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma.hpp
# Opt level: O0

void __thiscall Statement::Statement(Statement *this)

{
  Statement *this_local;
  
  AnalysisInterface::AnalysisInterface(&this->super_AnalysisInterface);
  (this->super_AnalysisInterface)._vptr_AnalysisInterface = (_func_int **)&PTR_Parse_0020d5d8;
  OutputStatement::OutputStatement(&this->m_output_statement);
  InputStatement::InputStatement(&this->m_input_statement);
  ReturnStatement::ReturnStatement(&this->m_return_statement);
  AssignStatement::AssignStatement(&this->m_assign_statement);
  FunctionCall::FunctionCall(&this->m_function_call);
  ConditionStatement::ConditionStatement(&this->m_condition_statement);
  WhileLoopStatement::WhileLoopStatement(&this->m_while_loop_statement);
  SwitchStatement::SwitchStatement(&this->m_switch_statement);
  return;
}

Assistant:

void LogOutput() {
        string str("This is a statement");
        g_log_tools->GrammaNormalLogs(str);
    }